

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.h
# Opt level: O2

void __thiscall ncnn::Mat::create(Mat *this,int _w,int _h,size_t _elemsize,Allocator *_allocator)

{
  int iVar1;
  ulong uVar2;
  void *local_30;
  
  if ((((this->dims != 2) || (this->w != _w)) || (this->h != _h)) ||
     (((this->elemsize != _elemsize || (this->elempack != 1)) || (this->allocator != _allocator))))
  {
    release(this);
    this->elemsize = _elemsize;
    this->elempack = 1;
    this->allocator = _allocator;
    this->dims = 2;
    this->w = _w;
    this->h = _h;
    this->c = 1;
    iVar1 = _h * _w;
    this->cstep = (long)iVar1;
    if (iVar1 != 0) {
      uVar2 = (long)iVar1 * _elemsize + 3 & 0xfffffffffffffffc;
      if (_allocator == (Allocator *)0x0) {
        local_30 = (void *)0x0;
        iVar1 = posix_memalign(&local_30,0x10,uVar2 + 4);
        if (iVar1 != 0) {
          local_30 = (void *)0x0;
        }
      }
      else {
        local_30 = (void *)(**(code **)(*(long *)_allocator + 0x10))(_allocator,uVar2 + 4);
      }
      this->data = local_30;
      this->refcount = (int *)((long)local_30 + uVar2);
      *(undefined4 *)((long)local_30 + uVar2) = 1;
    }
  }
  return;
}

Assistant:

inline void Mat::create(int _w, int _h, size_t _elemsize, Allocator* _allocator)
{
    if (dims == 2 && w == _w && h == _h && elemsize == _elemsize && elempack == 1 && allocator == _allocator)
        return;

    release();

    elemsize = _elemsize;
    elempack = 1;
    allocator = _allocator;

    dims = 2;
    w = _w;
    h = _h;
    c = 1;

    cstep = w * h;

    if (total() > 0)
    {
        size_t totalsize = alignSize(total() * elemsize, 4);
        if (allocator)
            data = allocator->fastMalloc(totalsize + (int)sizeof(*refcount));
        else
            data = fastMalloc(totalsize + (int)sizeof(*refcount));
        refcount = (int*)(((unsigned char*)data) + totalsize);
        *refcount = 1;
    }
}